

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::Dot::emit(Dot *this,OutputFile *o)

{
  uint uVar1;
  uint32_t l;
  OutputFile *pOVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_34;
  uint32_t j;
  uint local_28;
  uint32_t i;
  uint32_t n;
  OutputFile *o_local;
  Dot *this_local;
  
  uVar1 = this->cases->cases_size;
  if (uVar1 == 1) {
    pOVar2 = OutputFile::wlabel(o,(label_t)(this->from->label).value);
    pOVar2 = OutputFile::ws(pOVar2," -> ");
    pOVar2 = OutputFile::wlabel(pOVar2,(label_t)(this->cases->cases->to->label).value);
    OutputFile::ws(pOVar2,"\n");
  }
  else {
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      pOVar2 = OutputFile::wlabel(o,(label_t)(this->from->label).value);
      pOVar2 = OutputFile::ws(pOVar2," -> ");
      pOVar2 = OutputFile::wlabel(pOVar2,(label_t)((this->cases->cases[local_28].to)->label).value);
      OutputFile::ws(pOVar2," [label=\"");
      for (local_34 = 0;
          sVar3 = std::
                  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ::size(&this->cases->cases[local_28].ranges), local_34 < sVar3;
          local_34 = local_34 + 1) {
        pvVar4 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->cases->cases[local_28].ranges,(ulong)local_34);
        l = pvVar4->first;
        pvVar4 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->cases->cases[local_28].ranges,(ulong)local_34);
        OutputFile::wrange(o,l,pvVar4->second);
      }
      OutputFile::ws(o,"\"]\n");
    }
  }
  return;
}

Assistant:

void Dot::emit (OutputFile & o)
{
	const uint32_t n = cases->cases_size;
	if (n == 1)
	{
		o.wlabel(from->label).ws(" -> ").wlabel(cases->cases[0].to->label).ws("\n");
	}
	else
	{
		for (uint32_t i = 0; i < n; ++i)
		{
			o.wlabel(from->label).ws(" -> ").wlabel(cases->cases[i].to->label).ws(" [label=\"");
			for (uint32_t j = 0; j < cases->cases[i].ranges.size (); ++j)
			{
				o.wrange(cases->cases[i].ranges[j].first, cases->cases[i].ranges[j].second);
			}
			o.ws("\"]\n");
		}
	}
}